

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

string * __thiscall
pbrt::BVHLightSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,BVHLightSampler *this)

{
  vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *in_RCX;
  
  StringPrintf<pstd::vector<pbrt::LightBVHNode,pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>>const&>
            (__return_storage_ptr__,(pbrt *)"[ BVHLightSampler nodes: %s ]",(char *)&this->nodes,
             in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string BVHLightSampler::ToString() const {
    return StringPrintf("[ BVHLightSampler nodes: %s ]", nodes);
}